

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

void fs_event_create_files(uv_timer_t *handle)

{
  int iVar1;
  char *name;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t *handle_local;
  
  if (0xf < (long)fs_event_created) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x99,"fs_event_created","<","fs_event_file_count",(long)fs_event_created,"<",0x10);
    abort();
  }
  name = fs_event_get_filename(fs_event_created);
  create_file(name);
  fs_event_created = fs_event_created + 1;
  if (fs_event_created < 0x10) {
    iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
              ,0xa1,"uv_timer_start(&timer, fs_event_create_files, 100, 0)","==","0",(long)iVar1,
              "==",0);
      abort();
    }
  }
  return;
}

Assistant:

static void fs_event_create_files(uv_timer_t* handle) {
  /* Make sure we're not attempting to create files we do not intend */
  ASSERT_LT(fs_event_created, fs_event_file_count);

  /* Create the file */
  create_file(fs_event_get_filename(fs_event_created));

  if (++fs_event_created < fs_event_file_count) {
    /* Create another file on a different event loop tick.  We do it this way
     * to avoid fs events coalescing into one fs event. */
    ASSERT_OK(uv_timer_start(&timer, fs_event_create_files, 100, 0));
  }
}